

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorHandling.cpp
# Opt level: O0

void llvm::llvm_unreachable_internal(char *msg,char *file,uint line)

{
  ostream *poVar1;
  uint line_local;
  char *file_local;
  char *msg_local;
  
  if (msg != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,msg);
    std::operator<<(poVar1,"\n");
  }
  std::operator<<((ostream *)&std::cout,"UNREACHABLE executed");
  if (file != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout," at ");
    poVar1 = std::operator<<(poVar1,file);
    poVar1 = std::operator<<(poVar1,":");
    std::ostream::operator<<(poVar1,line);
  }
  std::operator<<((ostream *)&std::cout,"!\n");
  abort();
}

Assistant:

void llvm::llvm_unreachable_internal(const char *msg, const char *file,
                                     unsigned line) {
  // This code intentionally doesn't call the ErrorHandler callback, because
  // llvm_unreachable is intended to be used to indicate "impossible"
  // situations, and not legitimate runtime errors.
  // XXX BINARYEN: use cout
  if (msg)
    std::cout << msg << "\n";
  std::cout << "UNREACHABLE executed";
  if (file)
    std::cout << " at " << file << ":" << line;
  std::cout << "!\n";
  abort();
#ifdef LLVM_BUILTIN_UNREACHABLE
  // Windows systems and possibly others don't declare abort() to be noreturn,
  // so use the unreachable builtin to avoid a Clang self-host warning.
  LLVM_BUILTIN_UNREACHABLE;
#endif
}